

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase92::run(TestCase92 *this)

{
  PointerBuilder builder_00;
  PointerBuilder builder_01;
  PointerBuilder builder_02;
  PointerBuilder builder_03;
  PointerBuilder builder_04;
  Builder builder_05;
  Builder builder_06;
  Builder builder_07;
  Builder builder_08;
  Reader brand;
  undefined1 auVar1 [40];
  Reader reader;
  Reader reader_00;
  Builder builder_09;
  Builder builder_10;
  undefined8 uVar2;
  undefined2 uVar3;
  StructSchema schema;
  StructSchema SVar4;
  short sVar5;
  Type TVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StructSchema testListsSchema;
  SchemaLoader loader;
  Builder root;
  Builder root_1;
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition;
  DebugComparison<int,_short> _kjCondition_3;
  MallocMessageBuilder builder;
  Builder root_4;
  undefined1 local_8e0 [48];
  Builder local_8b0;
  char *local_880;
  undefined1 local_878 [8];
  undefined1 auStack_870 [24];
  bool local_858;
  undefined3 uStack_857;
  undefined2 uStack_854;
  undefined2 uStack_852;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  Reader local_6a8 [3];
  undefined1 in_stack_fffffffffffff9f0 [48];
  None *pNVar10;
  char *pcVar11;
  size_t sVar12;
  bool bVar13;
  undefined1 in_stack_fffffffffffffb09 [15];
  undefined8 in_stack_fffffffffffffb18;
  undefined1 auVar14 [8];
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  StructBuilder local_478;
  undefined1 local_450 [8];
  anon_union_400_1_a8c68091_for_NullableValue<kj::Exception>_2 aStack_448;
  MallocMessageBuilder local_2b8;
  Builder local_1c8 [8];
  
  SchemaLoader::SchemaLoader((SchemaLoader *)(local_8e0 + 8));
  local_450 = (undefined1  [8])(schemas::s_a0a8f314b80b63fd + 0x48);
  Schema::getProto(local_6a8,(Schema *)local_450);
  local_878 = (undefined1  [8])SchemaLoader::load((SchemaLoader *)(local_8e0 + 8),local_6a8);
  schema = Schema::asStruct((Schema *)local_878);
  local_878 = (undefined1  [8])(schemas::s_9c8e9318b29d9cd3 + 0x48);
  Schema::getProto(local_6a8,(Schema *)local_878);
  SchemaLoader::load((SchemaLoader *)(local_8e0 + 8),local_6a8);
  MallocMessageBuilder::MallocMessageBuilder(&local_2b8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)local_6a8,&local_2b8.super_MessageBuilder);
  builder_00.capTable = (CapTableBuilder *)local_6a8[0]._reader.capTable;
  builder_00.segment = (SegmentBuilder *)local_6a8[0]._reader.segment;
  builder_00.pointer = (WirePointer *)local_6a8[0]._reader.data;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic(&local_8b0,builder_00,schema);
  initDynamicTestMessage((Builder)in_stack_fffffffffffff9f0);
  SVar4.super_Schema.raw = local_8b0.schema.super_Schema.raw;
  StructBuilder::asReader((StructBuilder *)((long)&local_8b0 + 8));
  reader.reader.segment = (SegmentReader *)uStack_4a8;
  reader.schema.super_Schema.raw = SVar4.super_Schema.raw;
  reader.reader.capTable = (CapTableReader *)local_4a0;
  reader.reader.data = (void *)uStack_498;
  reader.reader.pointers = (WirePointer *)local_490;
  reader.reader._32_8_ = uStack_488;
  reader.reader._40_8_ = local_480;
  checkDynamicTestMessage(reader);
  Schema::requireUsableAs((Schema *)&local_8b0,(RawSchema *)schemas::s_a0a8f314b80b63fd);
  local_450 = (undefined1  [8])((ulong)local_450 & 0xffffffffffffff00);
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)local_878,(Maybe<kj::Exception> *)local_450);
  bVar13 = local_878[0];
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)local_6a8,(Maybe<kj::Exception> *)local_878);
  pNVar10 = (None *)&kj::none;
  pcVar11 = " != ";
  sVar12 = 5;
  if (local_878[0] == true) {
    kj::Exception::~Exception((Exception *)auStack_870);
  }
  if (local_450[0] == true) {
    kj::Exception::~Exception(&aStack_448.value);
  }
  if ((bVar13 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[93],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x6c,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.as<TestAllTypes>(); }) != kj::none\", _kjCondition"
               ,(char (*) [93])
                "failed: expected ::kj::runCatchingExceptions([&]() { root.as<TestAllTypes>(); }) != kj::none"
               ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_6a8);
  }
  if (local_6a8[0]._reader.segment._0_1_ == true) {
    kj::Exception::~Exception((Exception *)&local_6a8[0]._reader.capTable);
  }
  MessageBuilder::getRootInternal((Builder *)local_878,&local_2b8.super_MessageBuilder);
  local_6a8[0]._reader.data = (void *)auStack_870._8_8_;
  local_6a8[0]._reader.segment = (SegmentReader *)local_878;
  local_6a8[0]._reader.capTable = (CapTableReader *)auStack_870._0_8_;
  PointerBuilder::getStruct(&local_478,(PointerBuilder *)local_6a8,(StructSize)0x140006,(word *)0x0)
  ;
  builder_05._builder.capTable = local_478.capTable;
  builder_05._builder.segment = local_478.segment;
  builder_05._builder.data = local_478.data;
  builder_05._builder.pointers = local_478.pointers;
  builder_05._builder.dataSize = local_478.dataSize;
  builder_05._builder.pointerCount = local_478.pointerCount;
  builder_05._builder._38_2_ = local_478._38_2_;
  checkTestMessage(builder_05);
  MallocMessageBuilder::~MallocMessageBuilder(&local_2b8);
  SchemaLoader::loadNative((SchemaLoader *)(local_8e0 + 8),(RawSchema *)schemas::s_a0a8f314b80b63fd)
  ;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_6a8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)local_450,(MessageBuilder *)local_6a8);
  builder_01.capTable = (CapTableBuilder *)aStack_448.value.ownFile.content.ptr;
  builder_01.segment = (SegmentBuilder *)local_450;
  builder_01.pointer = (WirePointer *)aStack_448.value.ownFile.content.size_;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
            ((Builder *)local_878,builder_01,schema);
  initDynamicTestMessage((Builder)in_stack_fffffffffffff9f0);
  Schema::requireUsableAs((Schema *)local_878,(RawSchema *)schemas::s_a0a8f314b80b63fd);
  builder_06._builder._36_4_ = uStack_84c;
  builder_06._builder.dataSize = uStack_850;
  builder_06._builder.pointers._4_2_ = uStack_854;
  builder_06._builder.pointers._0_4_ = _local_858;
  builder_06._builder.pointers._6_2_ = uStack_852;
  builder_06._builder.capTable = (CapTableBuilder *)auStack_870._8_8_;
  builder_06._builder.segment = (SegmentBuilder *)auStack_870._0_8_;
  builder_06._builder.data = (void *)auStack_870._16_8_;
  checkTestMessage(builder_06);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_6a8);
  SchemaLoader::loadNative((SchemaLoader *)(local_8e0 + 8),(RawSchema *)schemas::s_a851ad32cbc2ffea)
  ;
  local_6b8 = 0;
  local_6d8 = 0;
  uStack_6d0 = 0;
  local_6c8 = 0;
  uStack_6c0 = 0;
  uStack_6b0 = 0x7fffffff;
  auVar1 = ZEXT1640(ZEXT816(0));
  brand._reader._40_8_ = 0x7fffffff;
  brand._reader.segment = (SegmentReader *)auVar1._0_8_;
  brand._reader.capTable = (CapTableReader *)auVar1._8_8_;
  brand._reader.data = (void *)auVar1._16_8_;
  brand._reader.pointers = (WirePointer *)auVar1._24_8_;
  brand._reader.dataSize = auVar1._32_4_;
  brand._reader.pointerCount = auVar1._36_2_;
  brand._reader._38_2_ = auVar1._38_2_;
  local_6a8[0]._reader.segment =
       (SegmentReader *)
       SchemaLoader::get((SchemaLoader *)(local_8e0 + 8),0xa851ad32cbc2ffea,brand,(Schema)0x6d3cd8);
  local_8e0._0_8_ = Schema::asStruct((Schema *)local_6a8);
  local_6a8[0]._reader.capTable = (CapTableReader *)(schemas::s_a851ad32cbc2ffea + 0x48);
  local_6a8[0]._reader.data = " != ";
  local_6a8[0]._reader.pointers = (WirePointer *)&DAT_00000005;
  local_6a8[0]._reader.dataSize._0_1_ =
       (RawBrandedSchema *)local_8e0._0_8_ !=
       (RawBrandedSchema *)(schemas::s_a851ad32cbc2ffea + 0x48);
  local_6a8[0]._reader.segment = (SegmentReader *)local_8e0;
  if ((!(bool)(undefined1)local_6a8[0]._reader.dataSize) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[69],kj::_::DebugComparison<capnp::StructSchema&,capnp::StructSchema>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x83,ERROR,
               "\"failed: expected \" \"testListsSchema != Schema::from<TestListDefaults>()\", _kjCondition"
               ,(char (*) [69])
                "failed: expected testListsSchema != Schema::from<TestListDefaults>()",
               (DebugComparison<capnp::StructSchema_&,_capnp::StructSchema> *)local_6a8);
  }
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_6a8,0x400,GROW_HEURISTICALLY);
  uVar2 = local_8e0._0_8_;
  MessageBuilder::getRootInternal((Builder *)local_450,(MessageBuilder *)local_6a8);
  builder_02.capTable = (CapTableBuilder *)aStack_448.value.ownFile.content.ptr;
  builder_02.segment = (SegmentBuilder *)local_450;
  builder_02.pointer = (WirePointer *)aStack_448.value.ownFile.content.size_;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
            ((Builder *)local_878,builder_02,(StructSchema)uVar2);
  builder_09.builder.segment = (SegmentBuilder *)pcVar11;
  builder_09.schema.super_Schema.raw = (Schema)(Schema)pNVar10;
  builder_09.builder.capTable = (CapTableBuilder *)sVar12;
  builder_09.builder.data._0_1_ = bVar13;
  builder_09.builder._17_15_ = in_stack_fffffffffffffb09;
  builder_09.builder.dataSize = (int)in_stack_fffffffffffffb18;
  builder_09.builder.pointerCount = (short)((ulong)in_stack_fffffffffffffb18 >> 0x20);
  builder_09.builder._38_2_ = (short)((ulong)in_stack_fffffffffffffb18 >> 0x30);
  initDynamicTestLists(builder_09);
  auVar14 = local_878;
  StructBuilder::asReader((StructBuilder *)auStack_870);
  reader_00.reader.segment = (SegmentReader *)uStack_4e0;
  reader_00.schema.super_Schema.raw = (Schema)(Schema)auVar14;
  reader_00.reader.capTable = (CapTableReader *)local_4d8;
  reader_00.reader.data = (void *)uStack_4d0;
  reader_00.reader.pointers = (WirePointer *)local_4c8;
  reader_00.reader._32_8_ = uStack_4c0;
  reader_00.reader._40_8_ = local_4b8;
  checkDynamicTestLists(reader_00);
  Schema::requireUsableAs((Schema *)local_878,(RawSchema *)schemas::s_a851ad32cbc2ffea);
  builder_07._builder._36_4_ = uStack_84c;
  builder_07._builder.dataSize = uStack_850;
  builder_07._builder.pointers._4_2_ = uStack_854;
  builder_07._builder.pointers._0_4_ = _local_858;
  builder_07._builder.pointers._6_2_ = uStack_852;
  builder_07._builder.capTable = (CapTableBuilder *)auStack_870._8_8_;
  builder_07._builder.segment = (SegmentBuilder *)auStack_870._0_8_;
  builder_07._builder.data = (void *)auStack_870._16_8_;
  checkTestMessage(builder_07);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_6a8);
  local_450 = (undefined1  [8])(schemas::s_a851ad32cbc2ffea + 0x48);
  Schema::getProto(local_6a8,(Schema *)local_450);
  local_878 = (undefined1  [8])SchemaLoader::load((SchemaLoader *)(local_8e0 + 8),local_6a8);
  auStack_870._8_8_ = " == ";
  auStack_870._16_8_ = &DAT_00000005;
  local_858 = local_878 == (undefined1  [8])local_8e0._0_8_;
  auStack_870._0_8_ = (SegmentBuilder *)local_8e0;
  if ((local_878 != (undefined1  [8])local_8e0._0_8_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[93],kj::_::DebugComparison<capnp::Schema,capnp::StructSchema&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x8f,ERROR,
               "\"failed: expected \" \"loader.load(Schema::from<TestListDefaults>().getProto()) == testListsSchema\", _kjCondition"
               ,(char (*) [93])
                "failed: expected loader.load(Schema::from<TestListDefaults>().getProto()) == testListsSchema"
               ,(DebugComparison<capnp::Schema,_capnp::StructSchema_&> *)local_878);
  }
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_6a8,0x400,GROW_HEURISTICALLY);
  uVar2 = local_8e0._0_8_;
  MessageBuilder::getRootInternal((Builder *)local_450,(MessageBuilder *)local_6a8);
  builder_03.capTable = (CapTableBuilder *)aStack_448.value.ownFile.content.ptr;
  builder_03.segment = (SegmentBuilder *)local_450;
  builder_03.pointer = (WirePointer *)aStack_448.value.ownFile.content.size_;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
            ((Builder *)local_878,builder_03,(StructSchema)uVar2);
  builder_10.builder.segment = (SegmentBuilder *)pcVar11;
  builder_10.schema.super_Schema.raw = (Schema)(Schema)pNVar10;
  builder_10.builder.capTable = (CapTableBuilder *)sVar12;
  builder_10.builder.data._0_1_ = bVar13;
  builder_10.builder._17_15_ = in_stack_fffffffffffffb09;
  builder_10.builder._32_8_ = auVar14;
  initDynamicTestLists(builder_10);
  Schema::requireUsableAs((Schema *)local_878,(RawSchema *)schemas::s_a851ad32cbc2ffea);
  builder_08._builder._36_4_ = uStack_84c;
  builder_08._builder.dataSize = uStack_850;
  builder_08._builder.pointers._4_2_ = uStack_854;
  builder_08._builder.pointers._0_4_ = _local_858;
  builder_08._builder.pointers._6_2_ = uStack_852;
  builder_08._builder.capTable = (CapTableBuilder *)auStack_870._8_8_;
  builder_08._builder.segment = (SegmentBuilder *)auStack_870._0_8_;
  builder_08._builder.data = (void *)auStack_870._16_8_;
  checkTestMessage(builder_08);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_6a8);
  local_450 = (undefined1  [8])(schemas::s_f47697362233ce52 + 0x48);
  Schema::getProto(local_6a8,(Schema *)local_450);
  local_878 = (undefined1  [8])SchemaLoader::load((SchemaLoader *)(local_8e0 + 8),local_6a8);
  SVar4 = Schema::asStruct((Schema *)local_878);
  local_878 = (undefined1  [8])(schemas::s_fc76a82eecb7a718 + 0x48);
  Schema::getProto(local_6a8,(Schema *)local_878);
  SchemaLoader::load((SchemaLoader *)(local_8e0 + 8),local_6a8);
  local_878 = (undefined1  [8])(schemas::s_ee0a6b99b7dc7ab2 + 0x48);
  Schema::getProto(local_6a8,(Schema *)local_878);
  SchemaLoader::load((SchemaLoader *)(local_8e0 + 8),local_6a8);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_6a8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)local_878,(MessageBuilder *)local_6a8);
  builder_04.capTable = (CapTableBuilder *)auStack_870._0_8_;
  builder_04.segment = (SegmentBuilder *)local_878;
  builder_04.pointer = (WirePointer *)auStack_870._8_8_;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic(local_1c8,builder_04,SVar4);
  name.content.size_ = 7;
  name.content.ptr = "union0";
  DynamicStruct::Builder::get((Builder *)local_450,local_1c8,name);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&local_2b8,(Builder *)local_450);
  local_878._0_4_ = INT;
  auStack_870._0_8_ = (char *)0x7b;
  name_01.content.size_ = 8;
  name_01.content.ptr = "u0f1s16";
  DynamicStruct::Builder::set((Builder *)&local_2b8,name_01,(Reader *)local_878);
  DynamicValue::Reader::~Reader((Reader *)local_878);
  DynamicValue::Builder::~Builder((Builder *)local_450);
  name_00.content.size_ = 7;
  name_00.content.ptr = "union1";
  DynamicStruct::Builder::get((Builder *)local_450,local_1c8,name_00);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&local_2b8,(Builder *)local_450);
  local_878._0_4_ = 6;
  auStack_870._0_8_ = "hello";
  auStack_870._8_8_ = 6;
  name_02.content.size_ = 7;
  name_02.content.ptr = "u1f0sp";
  DynamicStruct::Builder::set((Builder *)&local_2b8,name_02,(Reader *)local_878);
  DynamicValue::Reader::~Reader((Reader *)local_878);
  DynamicValue::Builder::~Builder((Builder *)local_450);
  MessageBuilder::getRootInternal((Builder *)&local_8b0,(MessageBuilder *)local_6a8);
  local_2b8.super_MessageBuilder.arenaSpace[1] = local_8b0.builder.capTable;
  local_2b8.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)local_8b0.schema.super_Schema.raw;
  local_2b8.super_MessageBuilder.arenaSpace[0] = local_8b0.builder.segment;
  PointerBuilder::getStruct
            ((StructBuilder *)local_450,(PointerBuilder *)&local_2b8,(StructSize)0x20008,(word *)0x0
            );
  StructBuilder::asReader((StructBuilder *)local_450);
  if ((uint)_local_858 < 0x50) {
    sVar5 = 0;
  }
  else {
    sVar5 = *(short *)(auStack_870._8_8_ + 8);
  }
  local_450._4_2_ = sVar5;
  local_450._0_4_ = 0x7b;
  aStack_448.value.ownFile.content.ptr = " == ";
  aStack_448.value.ownFile.content.size_ = 5;
  aStack_448._16_1_ = sVar5 == 0x7b;
  if ((!(bool)aStack_448._16_1_) && (kj::_::Debug::minSeverity < 3)) {
    local_2b8.super_MessageBuilder._vptr_MessageBuilder =
         (_func_int **)CONCAT44(local_2b8.super_MessageBuilder._vptr_MessageBuilder._4_4_,0x7b);
    if ((uint)_local_858 < 0x50) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(undefined2 *)(auStack_870._8_8_ + 8);
    }
    local_8b0.schema.super_Schema.raw._0_2_ = uVar3;
    kj::_::Debug::log<char_const(&)[60],kj::_::DebugComparison<int,short>&,int,short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0xa5,ERROR,
               "\"failed: expected \" \"(123) == (reader.getUnion0().getU0f1s16())\", _kjCondition, 123, reader.getUnion0().getU0f1s16()"
               ,(char (*) [60])"failed: expected (123) == (reader.getUnion0().getU0f1s16())",
               (DebugComparison<int,_short> *)local_450,(int *)&local_2b8,(short *)&local_8b0);
  }
  local_880 = "hello";
  local_2b8.super_MessageBuilder.arenaSpace[1] = (ArrayDisposer *)(auStack_870._16_8_ + 8);
  if ((ushort)uStack_854 < 2) {
    local_2b8.super_MessageBuilder.arenaSpace[1] = (ArrayDisposer *)0x0;
  }
  if ((ushort)uStack_854 < 2) {
    TVar6 = UNKNOWN;
    uVar7 = 0;
    uVar8 = 0;
    uVar9 = 0;
    local_2b8.super_MessageBuilder.arenaSpace[2]._0_4_ = 0x7fffffff;
  }
  else {
    TVar6 = local_878._0_4_;
    uVar7 = local_878._4_4_;
    uVar8 = auStack_870._0_4_;
    uVar9 = auStack_870._4_4_;
    local_2b8.super_MessageBuilder.arenaSpace[2]._0_4_ = uStack_850;
  }
  local_2b8.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)CONCAT44(uVar7,TVar6);
  local_2b8.super_MessageBuilder.arenaSpace[0] = (void *)CONCAT44(uVar9,uVar8);
  local_8b0._0_16_ = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_2b8,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[6]>::operator==
            ((DebugComparison<const_char_(&)[6],_capnp::Text::Reader> *)local_450,
             (DebugExpression<char_const(&)[6]> *)&local_880,(Reader *)&local_8b0);
  if ((aStack_448.value.line._0_1_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_2b8.super_MessageBuilder.arenaSpace[1] = (ArrayDisposer *)(auStack_870._16_8_ + 8);
    if ((ushort)uStack_854 < 2) {
      local_2b8.super_MessageBuilder.arenaSpace[1] = (ArrayDisposer *)0x0;
    }
    if ((ushort)uStack_854 < 2) {
      TVar6 = UNKNOWN;
      uVar7 = 0;
      uVar8 = 0;
      uVar9 = 0;
      uStack_850 = 0x7fffffff;
    }
    else {
      TVar6 = local_878._0_4_;
      uVar7 = local_878._4_4_;
      uVar8 = auStack_870._0_4_;
      uVar9 = auStack_870._4_4_;
    }
    local_2b8.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)CONCAT44(uVar7,TVar6);
    local_2b8.super_MessageBuilder.arenaSpace[0] = (void *)CONCAT44(uVar9,uVar8);
    local_2b8.super_MessageBuilder.arenaSpace[2]._0_4_ = uStack_850;
    local_8b0._0_16_ =
         PointerReader::getBlob<capnp::Text>((PointerReader *)&local_2b8,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[63],kj::_::DebugComparison<char_const(&)[6],capnp::Text::Reader>&,char_const(&)[6],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0xa6,ERROR,
               "\"failed: expected \" \"(\\\"hello\\\") == (reader.getUnion1().getU1f0sp())\", _kjCondition, \"hello\", reader.getUnion1().getU1f0sp()"
               ,(char (*) [63])"failed: expected (\"hello\") == (reader.getUnion1().getU1f0sp())",
               (DebugComparison<const_char_(&)[6],_capnp::Text::Reader> *)local_450,
               (char (*) [6])"hello",(Reader *)&local_8b0);
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_6a8);
  SchemaLoader::~SchemaLoader((SchemaLoader *)(local_8e0 + 8));
  return;
}

Assistant:

TEST(SchemaLoader, Use) {
  SchemaLoader loader;

  StructSchema schema = loader.load(Schema::from<TestAllTypes>().getProto()).asStruct();

  // Also have to load TestEnum.
  loader.load(Schema::from<TestEnum>().getProto());

  {
    MallocMessageBuilder builder;
    auto root = builder.getRoot<DynamicStruct>(schema);

    initDynamicTestMessage(root);
    checkDynamicTestMessage(root.asReader());

    // Can't convert to TestAllTypes because we didn't use loadCompiledTypeAndDependencies().
    EXPECT_ANY_THROW(root.as<TestAllTypes>());

    // But if we reinterpret the raw bytes, it works.
    checkTestMessage(builder.getRoot<TestAllTypes>());
  }

  loader.loadCompiledTypeAndDependencies<TestAllTypes>();

  {
    MallocMessageBuilder builder;
    auto root = builder.getRoot<DynamicStruct>(schema);

    initDynamicTestMessage(root);

    // Now we can actually cast.
    checkTestMessage(root.as<TestAllTypes>());
  }

  // Let's also test TestListDefaults, but as we do so, let's load the compiled types first, to
  // make sure the opposite order works.

  loader.loadCompiledTypeAndDependencies<TestListDefaults>();
  StructSchema testListsSchema = loader.get(typeId<TestListDefaults>()).asStruct();
  EXPECT_TRUE(testListsSchema != Schema::from<TestListDefaults>());

  {
    MallocMessageBuilder builder;
    auto root = builder.getRoot<DynamicStruct>(testListsSchema);

    initDynamicTestLists(root);
    checkDynamicTestLists(root.asReader());

    checkTestMessage(root.as<TestListDefaults>());
  }

  EXPECT_TRUE(loader.load(Schema::from<TestListDefaults>().getProto()) == testListsSchema);

  {
    MallocMessageBuilder builder;
    auto root = builder.getRoot<DynamicStruct>(testListsSchema);

    initDynamicTestLists(root);
    checkTestMessage(root.as<TestListDefaults>());
  }

  // Finally, let's test some unions.
  StructSchema unionSchema = loader.load(Schema::from<TestUnion>().getProto()).asStruct();
  loader.load(Schema::from<TestUnion::Union0>().getProto());
  loader.load(Schema::from<TestUnion::Union1>().getProto());
  {
    MallocMessageBuilder builder;
    auto root = builder.getRoot<DynamicStruct>(unionSchema);

    root.get("union0").as<DynamicStruct>().set("u0f1s16", 123);
    root.get("union1").as<DynamicStruct>().set("u1f0sp", "hello");

    auto reader = builder.getRoot<TestUnion>().asReader();
    EXPECT_EQ(123, reader.getUnion0().getU0f1s16());
    EXPECT_EQ("hello", reader.getUnion1().getU1f0sp());
  }
}